

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

TableOfContentsNode * __thiscall
soul::findOrCreateNode
          (soul *this,TableOfContentsNode *node,
          ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          path)

{
  TableOfContentsNode *pTVar1;
  __type_conflict1 _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  TableOfContentsNode *c;
  TableOfContentsNode *__rhs;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> AVar4;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_00;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  TableOfContentsNode local_70;
  
  pbVar3 = path.e;
  local_80.e = path.s;
  if (node != (TableOfContentsNode *)local_80.e) {
    local_80.s = &node->name;
    __lhs = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::front(&local_80);
    if (((long)local_80.e - (long)local_80.s == 0x20) &&
       (_Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this), _Var2)) {
      return (TableOfContentsNode *)this;
    }
    pTVar1 = *(TableOfContentsNode **)(this + 0x28);
    for (__rhs = *(TableOfContentsNode **)(this + 0x20); __rhs != pTVar1; __rhs = __rhs + 1) {
      _Var2 = std::operator==(__lhs,&__rhs->name);
      if (_Var2) goto LAB_00215054;
    }
    local_70.name._M_dataplus._M_p = (pointer)&local_70.name.field_2;
    local_70.name._M_string_length = 0;
    local_70.name.field_2._M_local_buf[0] = '\0';
    local_70.children.
    super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.children.
    super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.children.
    super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.module = (Module *)0x0;
    local_70.file = (File *)0x0;
    std::
    vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
    ::emplace_back<soul::SourceCodeModel::TableOfContentsNode>
              ((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                *)(this + 0x20),&local_70);
    SourceCodeModel::TableOfContentsNode::~TableOfContentsNode(&local_70);
    this = (soul *)(*(long *)(this + 0x28) + -0x48);
    std::__cxx11::string::_M_assign((string *)this);
    __rhs = (TableOfContentsNode *)this;
    if (0x20 < (ulong)((long)local_80.e - (long)local_80.s)) {
LAB_00215054:
      AVar4 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::tail(&local_80);
      path_00.s = AVar4.e;
      path_00.e = pbVar3;
      this = (soul *)findOrCreateNode((soul *)__rhs,(TableOfContentsNode *)AVar4.s,path_00);
    }
  }
  return (TableOfContentsNode *)this;
}

Assistant:

static SourceCodeModel::TableOfContentsNode& findOrCreateNode (SourceCodeModel::TableOfContentsNode& node,
                                                               ArrayView<std::string> path)
{
    if (path.empty())
        return node;

    auto& firstPart = path.front();

    if (path.size() == 1 && firstPart == node.name)
        return node;

    for (auto& c : node.children)
        if (firstPart == c.name)
            return findOrCreateNode (c, path.tail());

    node.children.push_back ({});
    auto& n = node.children.back();
    n.name = firstPart;
    return path.size() > 1 ? findOrCreateNode (n, path.tail()) : n;
}